

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  GLuint GVar1;
  SDL_Window *pSVar2;
  GLuint *pGVar3;
  SDLTest_CommonState *pSVar4;
  shader_data *psVar5;
  int iVar6;
  int iVar7;
  GLuint GVar8;
  GLenum GVar9;
  GLint GVar10;
  uint uVar11;
  uint uVar12;
  GLenum extraout_EAX;
  undefined8 uVar13;
  SDL_GLContext pvVar14;
  GLubyte *pGVar15;
  undefined8 uVar16;
  undefined8 *puVar17;
  undefined8 *puVar18;
  long lVar19;
  char *pcVar20;
  long lVar21;
  undefined8 uStack_70;
  undefined1 auStack_68 [12];
  int value;
  int local_58;
  int local_54;
  int h;
  int w;
  SDL_DisplayMode mode;
  
  puVar18 = (undefined8 *)auStack_68;
  uStack_70 = 0x104f21;
  state = (SDLTest_CommonState *)SDLTest_CommonCreateState(argv,0x20);
  if (state == (SDLTest_CommonState *)0x0) {
    return 1;
  }
  local_54 = 0;
  local_58 = 0;
  for (iVar7 = 1; pSVar4 = state, iVar7 < argc; iVar7 = iVar7 + iVar6) {
    uStack_70 = 0x104f73;
    iVar6 = SDLTest_CommonArg(state,iVar7);
    if (iVar6 == 0) {
      uStack_70 = 0x104f8d;
      iVar6 = SDL_strcasecmp(argv[iVar7],"--fsaa");
      if (iVar6 == 0) {
        local_58 = local_58 + 1;
      }
      else {
        uStack_70 = 0x104fa1;
        iVar6 = SDL_strcasecmp(argv[iVar7],"--accel");
        if (iVar6 == 0) {
          local_54 = local_54 + 1;
        }
        else {
          uStack_70 = 0x104fb5;
          iVar6 = SDL_strcasecmp(argv[iVar7],"--zdepth");
          if ((iVar6 != 0) || (argv[(long)iVar7 + 1] == (char *)0x0)) goto LAB_00105092;
          iVar7 = iVar7 + 1;
          uStack_70 = 0x104fd2;
          depth = SDL_atoi();
        }
      }
      iVar6 = 1;
    }
    else if (iVar6 < 0) {
LAB_00105092:
      pcVar20 = *argv;
      uStack_70 = 0x1050a1;
      uVar13 = SDLTest_CommonUsage(state);
      uStack_70 = 0x1050b5;
      SDL_Log("Usage: %s %s [--fsaa] [--accel] [--zdepth %%d]\n",pcVar20,uVar13);
      do {
        puVar17 = (undefined8 *)((long)puVar18 + -8);
        *(undefined8 *)((long)puVar18 + -8) = 1;
LAB_001057ac:
        uVar13 = *puVar17;
        *puVar17 = 0x1057b2;
        quit((int)uVar13);
        puVar18 = puVar17 + 1;
LAB_001057b2:
        uVar11 = state->render_flags;
        *(undefined8 *)((long)puVar18 + -8) = 0x1057ca;
        SDL_GL_SetSwapInterval(uVar11 >> 2 & 1);
        *(undefined8 *)((long)puVar18 + -8) = 0x1057d9;
        SDL_GetCurrentDisplayMode(0,(undefined1 *)((long)puVar18 + 0x20));
        *(undefined8 *)((long)puVar18 + -8) = 0x1057eb;
        SDL_Log("Screen bpp: %d\n",*(undefined1 *)((long)puVar18 + 0x21));
        *(undefined8 *)((long)puVar18 + -8) = 0x1057fc;
        SDL_Log("\n");
        *(undefined8 *)((long)puVar18 + -8) = 0x105807;
        pGVar15 = (*ctx.glGetString)(0x1f00);
        *(undefined8 *)((long)puVar18 + -8) = 0x105818;
        SDL_Log("Vendor     : %s\n",pGVar15);
        *(undefined8 *)((long)puVar18 + -8) = 0x105823;
        pGVar15 = (*ctx.glGetString)(0x1f01);
        *(undefined8 *)((long)puVar18 + -8) = 0x105834;
        SDL_Log("Renderer   : %s\n",pGVar15);
        *(undefined8 *)((long)puVar18 + -8) = 0x10583f;
        pGVar15 = (*ctx.glGetString)(0x1f02);
        *(undefined8 *)((long)puVar18 + -8) = 0x105850;
        SDL_Log("Version    : %s\n",pGVar15);
        *(undefined8 *)((long)puVar18 + -8) = 0x10585b;
        pGVar15 = (*ctx.glGetString)(0x1f03);
        *(undefined8 *)((long)puVar18 + -8) = 0x10586c;
        SDL_Log("Extensions : %s\n",pGVar15);
        *(undefined8 *)((long)puVar18 + -8) = 0x105876;
        SDL_Log("\n");
        *(undefined8 *)((long)puVar18 + -8) = 0x105882;
        iVar7 = SDL_GL_GetAttribute(0,(undefined1 *)((long)puVar18 + 0xc));
        if (iVar7 == 0) {
          *(undefined8 *)((long)puVar18 + -8) = 5;
          uVar13 = *(undefined8 *)((long)puVar18 + -8);
          *(undefined8 *)((long)puVar18 + -8) = 0x10589b;
          SDL_Log("SDL_GL_RED_SIZE: requested %d, got %d\n",uVar13,
                  *(undefined4 *)((long)puVar18 + 0xc));
        }
        else {
          *(undefined8 *)((long)puVar18 + -8) = 0x1058a2;
          uVar13 = SDL_GetError();
          *(undefined8 *)((long)puVar18 + -8) = 0x1058b3;
          SDL_Log("Failed to get SDL_GL_RED_SIZE: %s\n",uVar13);
        }
        *(undefined8 *)((long)puVar18 + -8) = 1;
        uVar13 = *(undefined8 *)((long)puVar18 + -8);
        *(undefined8 *)((long)puVar18 + -8) = 0x1058c0;
        iVar7 = SDL_GL_GetAttribute(uVar13,(undefined1 *)((long)puVar18 + 0xc));
        if (iVar7 == 0) {
          *(undefined8 *)((long)puVar18 + -8) = 5;
          uVar13 = *(undefined8 *)((long)puVar18 + -8);
          *(undefined8 *)((long)puVar18 + -8) = 0x1058d9;
          SDL_Log("SDL_GL_GREEN_SIZE: requested %d, got %d\n",uVar13,
                  *(undefined4 *)((long)puVar18 + 0xc));
        }
        else {
          *(undefined8 *)((long)puVar18 + -8) = 0x1058e0;
          uVar13 = SDL_GetError();
          *(undefined8 *)((long)puVar18 + -8) = 0x1058f1;
          SDL_Log("Failed to get SDL_GL_GREEN_SIZE: %s\n",uVar13);
        }
        *(undefined8 *)((long)puVar18 + -8) = 2;
        uVar13 = *(undefined8 *)((long)puVar18 + -8);
        *(undefined8 *)((long)puVar18 + -8) = 0x1058fe;
        iVar7 = SDL_GL_GetAttribute(uVar13,(undefined1 *)((long)puVar18 + 0xc));
        if (iVar7 == 0) {
          *(undefined8 *)((long)puVar18 + -8) = 5;
          uVar13 = *(undefined8 *)((long)puVar18 + -8);
          *(undefined8 *)((long)puVar18 + -8) = 0x105917;
          SDL_Log("SDL_GL_BLUE_SIZE: requested %d, got %d\n",uVar13,
                  *(undefined4 *)((long)puVar18 + 0xc));
        }
        else {
          *(undefined8 *)((long)puVar18 + -8) = 0x10591e;
          uVar13 = SDL_GetError();
          *(undefined8 *)((long)puVar18 + -8) = 0x10592f;
          SDL_Log("Failed to get SDL_GL_BLUE_SIZE: %s\n",uVar13);
        }
        *(undefined8 *)((long)puVar18 + -8) = 6;
        uVar13 = *(undefined8 *)((long)puVar18 + -8);
        *(undefined8 *)((long)puVar18 + -8) = 0x10593c;
        iVar7 = SDL_GL_GetAttribute(uVar13,(undefined1 *)((long)puVar18 + 0xc));
        if (iVar7 == 0) {
          *(undefined8 *)((long)puVar18 + -8) = 0x105958;
          SDL_Log("SDL_GL_DEPTH_SIZE: requested %d, got %d\n",depth,
                  *(undefined4 *)((long)puVar18 + 0xc));
        }
        else {
          *(undefined8 *)((long)puVar18 + -8) = 0x10595f;
          uVar13 = SDL_GetError();
          *(undefined8 *)((long)puVar18 + -8) = 0x105970;
          SDL_Log("Failed to get SDL_GL_DEPTH_SIZE: %s\n",uVar13);
        }
        if (*(int *)((long)puVar18 + 0x10) != 0) {
          *(undefined8 *)((long)puVar18 + -8) = 0xd;
          uVar13 = *(undefined8 *)((long)puVar18 + -8);
          *(undefined8 *)((long)puVar18 + -8) = 0x105984;
          iVar7 = SDL_GL_GetAttribute(uVar13,(undefined1 *)((long)puVar18 + 0xc));
          if (iVar7 == 0) {
            *(undefined8 *)((long)puVar18 + -8) = 0x10599a;
            SDL_Log("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n",
                    *(undefined4 *)((long)puVar18 + 0xc));
          }
          else {
            *(undefined8 *)((long)puVar18 + -8) = 0x1059a1;
            uVar13 = SDL_GetError();
            *(undefined8 *)((long)puVar18 + -8) = 0x1059b2;
            SDL_Log("Failed to get SDL_GL_MULTISAMPLEBUFFERS: %s\n",uVar13);
          }
          *(undefined8 *)((long)puVar18 + -8) = 0xe;
          uVar13 = *(undefined8 *)((long)puVar18 + -8);
          *(undefined8 *)((long)puVar18 + -8) = 0x1059bf;
          iVar7 = SDL_GL_GetAttribute(uVar13,(undefined1 *)((long)puVar18 + 0xc));
          if (iVar7 == 0) {
            *(undefined8 *)((long)puVar18 + -8) = 0x1059d9;
            SDL_Log("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n",
                    *(undefined4 *)((long)puVar18 + 0x10),*(undefined4 *)((long)puVar18 + 0xc));
          }
          else {
            *(undefined8 *)((long)puVar18 + -8) = 0x1059e0;
            uVar13 = SDL_GetError();
            *(undefined8 *)((long)puVar18 + -8) = 0x1059f1;
            SDL_Log("Failed to get SDL_GL_MULTISAMPLESAMPLES: %s\n",uVar13);
          }
        }
        if (*(int *)((long)puVar18 + 0x14) != 0) {
          *(undefined8 *)((long)puVar18 + -8) = 0xf;
          uVar13 = *(undefined8 *)((long)puVar18 + -8);
          *(undefined8 *)((long)puVar18 + -8) = 0x105a05;
          iVar7 = SDL_GL_GetAttribute(uVar13,(undefined1 *)((long)puVar18 + 0xc));
          if (iVar7 == 0) {
            *(undefined8 *)((long)puVar18 + -8) = 0x105a1b;
            SDL_Log("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n",
                    *(undefined4 *)((long)puVar18 + 0xc));
          }
          else {
            *(undefined8 *)((long)puVar18 + -8) = 0x105a22;
            uVar13 = SDL_GetError();
            *(undefined8 *)((long)puVar18 + -8) = 0x105a33;
            SDL_Log("Failed to get SDL_GL_ACCELERATED_VISUAL: %s\n",uVar13);
          }
        }
        iVar7 = state->num_windows;
        *(undefined8 *)((long)puVar18 + -8) = 0x24;
        uVar13 = *(undefined8 *)((long)puVar18 + -8);
        *(undefined8 *)((long)puVar18 + -8) = 0x105a46;
        datas = (shader_data *)SDL_calloc((long)iVar7,uVar13);
        *(undefined8 *)((long)puVar18 + -8) = 3;
        uVar13 = *(undefined8 *)((long)puVar18 + -8);
        lVar21 = 0;
        for (lVar19 = 0; lVar19 < state->num_windows; lVar19 = lVar19 + 1) {
          pSVar2 = state->windows[lVar19];
          pvVar14 = context[lVar19];
          *(undefined8 *)((long)puVar18 + -8) = 0x105a88;
          iVar7 = SDL_GL_MakeCurrent(pSVar2,pvVar14);
          if (iVar7 == 0) {
            pSVar2 = state->windows[lVar19];
            *(undefined8 *)((long)puVar18 + -8) = 0x105ac1;
            SDL_GL_GetDrawableSize
                      (pSVar2,(undefined1 *)((long)puVar18 + 0x1c),
                       (undefined1 *)((long)puVar18 + 0x18));
            *(undefined8 *)((long)puVar18 + -8) = 0x105ad3;
            (*ctx.glViewport)(0,0,*(GLsizei *)((long)puVar18 + 0x1c),
                              *(GLsizei *)((long)puVar18 + 0x18));
            psVar5 = datas;
            pGVar3 = &datas->shader_vert;
            *(undefined8 *)((long)&datas->angle_x + lVar21) = 0;
            *(undefined4 *)((long)&psVar5->angle_z + lVar21) = 0;
            *(undefined8 *)((long)puVar18 + -8) = 0x105afc;
            process_shader((GLuint *)((long)pGVar3 + lVar21),_shader_vert_src,0x8b31);
            pGVar3 = (GLuint *)((long)&psVar5->shader_program + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b18;
            process_shader(pGVar3 + 1,_shader_frag_src,0x8b30);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b1e;
            GVar8 = (*ctx.glCreateProgram)();
            *pGVar3 = GVar8;
            *(undefined8 *)((long)puVar18 + -8) = 0x105b29;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) goto LAB_00105d31;
            GVar8 = *(GLuint *)((long)&psVar5->shader_program + lVar21);
            GVar1 = *(GLuint *)((long)&psVar5->shader_vert + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b40;
            (*ctx.glAttachShader)(GVar8,GVar1);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b46;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x295;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->shader_program + lVar21);
            GVar1 = *(GLuint *)((long)&psVar5->shader_frag + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b5d;
            (*ctx.glAttachShader)(GVar8,GVar1);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b63;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x296;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->shader_program + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b75;
            (*ctx.glLinkProgram)(GVar8);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b7b;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x297;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->shader_program + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105b94;
            GVar10 = (*ctx.glGetAttribLocation)(GVar8,"av4position");
            *(GLint *)((long)&psVar5->attr_position + lVar21) = GVar10;
            *(undefined8 *)((long)puVar18 + -8) = 0x105b9f;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x29a;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->shader_program + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105bb8;
            GVar10 = (*ctx.glGetAttribLocation)(GVar8,"av3color");
            *(GLint *)((long)&psVar5->attr_color + lVar21) = GVar10;
            *(undefined8 *)((long)puVar18 + -8) = 0x105bc3;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x29b;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->shader_program + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105bdc;
            GVar10 = (*ctx.glGetUniformLocation)(GVar8,"mvp");
            *(GLint *)((long)&psVar5->attr_mvp + lVar21) = GVar10;
            *(undefined8 *)((long)puVar18 + -8) = 0x105be7;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x29e;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->shader_program + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105bf9;
            (*ctx.glUseProgram)(GVar8);
            *(undefined8 *)((long)puVar18 + -8) = 0x105bff;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x2a0;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->attr_position + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c12;
            (*ctx.glEnableVertexAttribArray)(GVar8);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c18;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x2a3;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->attr_color + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c2b;
            (*ctx.glEnableVertexAttribArray)(GVar8);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c31;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x2a4;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->attr_position + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c57;
            (*ctx.glVertexAttribPointer)(GVar8,(GLint)uVar13,0x1406,'\0',0,_vertices);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c5d;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x2a7;
              goto LAB_00105e3d;
            }
            GVar8 = *(GLuint *)((long)&psVar5->attr_color + lVar21);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c83;
            (*ctx.glVertexAttribPointer)(GVar8,(GLint)uVar13,0x1406,'\0',0,_colors);
            *(undefined8 *)((long)puVar18 + -8) = 0x105c89;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x2a8;
              goto LAB_00105e3d;
            }
            *(undefined8 *)((long)puVar18 + -8) = 0x105c9c;
            (*ctx.glEnable)(0xb44);
            *(undefined8 *)((long)puVar18 + -8) = 0x105ca2;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x2aa;
              goto LAB_00105e3d;
            }
            *(undefined8 *)((long)puVar18 + -8) = 0x105cb5;
            (*ctx.glEnable)(0xb71);
            *(undefined8 *)((long)puVar18 + -8) = 0x105cbb;
            GVar9 = (*ctx.glGetError)();
            if (GVar9 != 0) {
              uVar13 = 0x2ab;
              goto LAB_00105e3d;
            }
          }
          else {
            *(undefined8 *)((long)puVar18 + -8) = 0x105a91;
            uVar16 = SDL_GetError();
            *(undefined8 *)((long)puVar18 + -8) = 0x105a9e;
            SDL_Log("SDL_GL_MakeCurrent(): %s\n",uVar16);
          }
          lVar21 = lVar21 + 0x24;
        }
        frames = 0;
        *(undefined8 *)((long)puVar18 + -8) = 0x105cdb;
        uVar11 = SDL_GetTicks();
        done = 0;
        while (done == 0) {
          *(undefined8 *)((long)puVar18 + -8) = 0x105cef;
          loop();
        }
        *(undefined8 *)((long)puVar18 + -8) = 0x105cfc;
        uVar12 = SDL_GetTicks();
        if (uVar11 <= uVar12 && uVar12 - uVar11 != 0) {
          *(undefined8 *)((long)puVar18 + -8) = 0x105d2a;
          SDL_Log(((double)frames * 1000.0) / (double)(uVar12 - uVar11));
        }
        *(undefined8 *)((long)puVar18 + -8) = 0x105d31;
        quit(0);
        GVar9 = extraout_EAX;
LAB_00105d31:
        uVar13 = 0x292;
LAB_00105e3d:
        *(undefined8 *)((long)puVar18 + -8) = 0x105e44;
        SDL_Log("glGetError() = %i (0x%.8x) at line %i\n",GVar9,GVar9,uVar13);
      } while( true );
    }
  }
  *(byte *)&state->window_flags = (byte)state->window_flags | 0x33;
  pSVar4->gl_red_size = 5;
  pSVar4->gl_green_size = 5;
  pSVar4->gl_blue_size = 5;
  pSVar4->gl_depth_size = depth;
  pSVar4->gl_major_version = 2;
  pSVar4->gl_minor_version = 0;
  pSVar4->gl_profile_mask = 4;
  if (local_58 != 0) {
    pSVar4->gl_multisamplebuffers = 1;
    pSVar4->gl_multisamplesamples = local_58;
  }
  if (local_54 != 0) {
    pSVar4->gl_accelerated = 1;
  }
  uStack_70 = 0x10505f;
  iVar7 = SDLTest_CommonInit();
  if (iVar7 != 0) {
    uStack_70 = 0x10507a;
    context = (SDL_GLContext *)SDL_calloc((long)state->num_windows,8);
    if (context == (SDL_GLContext *)0x0) {
      pcVar20 = "Out of memory!\n";
LAB_001057a3:
      uStack_70 = 0x1057aa;
      SDL_Log(pcVar20);
    }
    else {
      lVar19 = 0;
      do {
        if (state->num_windows <= lVar19) {
          pcVar20 = "glActiveTexture";
          uStack_70 = 0x105118;
          ctx.glActiveTexture = (_func_void_GLenum *)SDL_GL_GetProcAddress("glActiveTexture");
          if (ctx.glActiveTexture != (_func_void_GLenum *)0x0) {
            pcVar20 = "glAttachShader";
            uStack_70 = 0x105137;
            ctx.glAttachShader = (_func_void_GLuint_GLuint *)SDL_GL_GetProcAddress("glAttachShader")
            ;
            if (ctx.glAttachShader != (_func_void_GLuint_GLuint *)0x0) {
              pcVar20 = "glBindAttribLocation";
              uStack_70 = 0x105156;
              ctx.glBindAttribLocation =
                   (_func_void_GLuint_GLuint_char_ptr *)
                   SDL_GL_GetProcAddress("glBindAttribLocation");
              if (ctx.glBindAttribLocation != (_func_void_GLuint_GLuint_char_ptr *)0x0) {
                pcVar20 = "glBindTexture";
                uStack_70 = 0x105175;
                ctx.glBindTexture =
                     (_func_void_GLenum_GLuint *)SDL_GL_GetProcAddress("glBindTexture");
                if (ctx.glBindTexture != (_func_void_GLenum_GLuint *)0x0) {
                  pcVar20 = "glBlendFuncSeparate";
                  uStack_70 = 0x105194;
                  ctx.glBlendFuncSeparate =
                       (_func_void_GLenum_GLenum_GLenum_GLenum *)
                       SDL_GL_GetProcAddress("glBlendFuncSeparate");
                  if (ctx.glBlendFuncSeparate != (_func_void_GLenum_GLenum_GLenum_GLenum *)0x0) {
                    pcVar20 = "glClear";
                    uStack_70 = 0x1051b3;
                    ctx.glClear = (_func_void_GLbitfield *)SDL_GL_GetProcAddress("glClear");
                    if (ctx.glClear != (_func_void_GLbitfield *)0x0) {
                      pcVar20 = "glClearColor";
                      uStack_70 = 0x1051d2;
                      ctx.glClearColor =
                           (_func_void_GLclampf_GLclampf_GLclampf_GLclampf *)
                           SDL_GL_GetProcAddress("glClearColor");
                      if (ctx.glClearColor != (_func_void_GLclampf_GLclampf_GLclampf_GLclampf *)0x0)
                      {
                        pcVar20 = "glCompileShader";
                        uStack_70 = 0x1051f1;
                        ctx.glCompileShader =
                             (_func_void_GLuint *)SDL_GL_GetProcAddress("glCompileShader");
                        if (ctx.glCompileShader != (_func_void_GLuint *)0x0) {
                          pcVar20 = "glCreateProgram";
                          uStack_70 = 0x105210;
                          ctx.glCreateProgram =
                               (_func_GLuint *)SDL_GL_GetProcAddress("glCreateProgram");
                          if (ctx.glCreateProgram != (_func_GLuint *)0x0) {
                            pcVar20 = "glCreateShader";
                            uStack_70 = 0x10522f;
                            ctx.glCreateShader =
                                 (_func_GLuint_GLenum *)SDL_GL_GetProcAddress("glCreateShader");
                            if (ctx.glCreateShader != (_func_GLuint_GLenum *)0x0) {
                              pcVar20 = "glDeleteProgram";
                              uStack_70 = 0x10524e;
                              ctx.glDeleteProgram =
                                   (_func_void_GLuint *)SDL_GL_GetProcAddress("glDeleteProgram");
                              if (ctx.glDeleteProgram != (_func_void_GLuint *)0x0) {
                                pcVar20 = "glDeleteShader";
                                uStack_70 = 0x10526d;
                                ctx.glDeleteShader =
                                     (_func_void_GLuint *)SDL_GL_GetProcAddress("glDeleteShader");
                                if (ctx.glDeleteShader != (_func_void_GLuint *)0x0) {
                                  pcVar20 = "glDeleteTextures";
                                  uStack_70 = 0x10528c;
                                  ctx.glDeleteTextures =
                                       (_func_void_GLsizei_GLuint_ptr *)
                                       SDL_GL_GetProcAddress("glDeleteTextures");
                                  if (ctx.glDeleteTextures != (_func_void_GLsizei_GLuint_ptr *)0x0)
                                  {
                                    pcVar20 = "glDisable";
                                    uStack_70 = 0x1052ab;
                                    ctx.glDisable =
                                         (_func_void_GLenum *)SDL_GL_GetProcAddress("glDisable");
                                    if (ctx.glDisable != (_func_void_GLenum *)0x0) {
                                      pcVar20 = "glDisableVertexAttribArray";
                                      uStack_70 = 0x1052ca;
                                      ctx.glDisableVertexAttribArray =
                                           (_func_void_GLuint *)
                                           SDL_GL_GetProcAddress("glDisableVertexAttribArray");
                                      if (ctx.glDisableVertexAttribArray != (_func_void_GLuint *)0x0
                                         ) {
                                        pcVar20 = "glDrawArrays";
                                        uStack_70 = 0x1052e9;
                                        ctx.glDrawArrays =
                                             (_func_void_GLenum_GLint_GLsizei *)
                                             SDL_GL_GetProcAddress("glDrawArrays");
                                        if (ctx.glDrawArrays !=
                                            (_func_void_GLenum_GLint_GLsizei *)0x0) {
                                          pcVar20 = "glEnable";
                                          uStack_70 = 0x105308;
                                          ctx.glEnable = (_func_void_GLenum *)
                                                         SDL_GL_GetProcAddress("glEnable");
                                          if (ctx.glEnable != (_func_void_GLenum *)0x0) {
                                            pcVar20 = "glEnableVertexAttribArray";
                                            uStack_70 = 0x105327;
                                            ctx.glEnableVertexAttribArray =
                                                 (_func_void_GLuint *)
                                                 SDL_GL_GetProcAddress("glEnableVertexAttribArray");
                                            if (ctx.glEnableVertexAttribArray !=
                                                (_func_void_GLuint *)0x0) {
                                              pcVar20 = "glFinish";
                                              uStack_70 = 0x105346;
                                              ctx.glFinish = (_func_void *)
                                                             SDL_GL_GetProcAddress("glFinish");
                                              if (ctx.glFinish != (_func_void *)0x0) {
                                                pcVar20 = "glGenFramebuffers";
                                                uStack_70 = 0x105365;
                                                ctx.glGenFramebuffers =
                                                     (_func_void_GLsizei_GLuint_ptr *)
                                                     SDL_GL_GetProcAddress("glGenFramebuffers");
                                                if (ctx.glGenFramebuffers !=
                                                    (_func_void_GLsizei_GLuint_ptr *)0x0) {
                                                  pcVar20 = "glGenTextures";
                                                  uStack_70 = 0x105384;
                                                  ctx.glGenTextures =
                                                       (_func_void_GLsizei_GLuint_ptr *)
                                                       SDL_GL_GetProcAddress("glGenTextures");
                                                  if (ctx.glGenTextures !=
                                                      (_func_void_GLsizei_GLuint_ptr *)0x0) {
                                                    pcVar20 = "glGetBooleanv";
                                                    uStack_70 = 0x1053a3;
                                                    ctx.glGetBooleanv =
                                                         (_func_void_GLenum_GLboolean_ptr *)
                                                         SDL_GL_GetProcAddress("glGetBooleanv");
                                                    if (ctx.glGetBooleanv !=
                                                        (_func_void_GLenum_GLboolean_ptr *)0x0) {
                                                      pcVar20 = "glGetString";
                                                      uStack_70 = 0x1053c2;
                                                      ctx.glGetString =
                                                           (_func_GLubyte_ptr_GLenum *)
                                                           SDL_GL_GetProcAddress("glGetString");
                                                      if (ctx.glGetString !=
                                                          (_func_GLubyte_ptr_GLenum *)0x0) {
                                                        pcVar20 = "glGetError";
                                                        uStack_70 = 0x1053e1;
                                                        ctx.glGetError =
                                                             (_func_GLenum *)
                                                             SDL_GL_GetProcAddress("glGetError");
                                                        if (ctx.glGetError != (_func_GLenum *)0x0) {
                                                          pcVar20 = "glGetIntegerv";
                                                          uStack_70 = 0x105400;
                                                          ctx.glGetIntegerv =
                                                               (_func_void_GLenum_GLint_ptr *)
                                                               SDL_GL_GetProcAddress
                                                                         ("glGetIntegerv");
                                                          if (ctx.glGetIntegerv !=
                                                              (_func_void_GLenum_GLint_ptr *)0x0) {
                                                            pcVar20 = "glGetProgramiv";
                                                            uStack_70 = 0x10541f;
                                                            ctx.glGetProgramiv =
                                                                 (_func_void_GLuint_GLenum_GLint_ptr
                                                                  *)SDL_GL_GetProcAddress
                                                                              ("glGetProgramiv");
                                                            if (ctx.glGetProgramiv !=
                                                                (_func_void_GLuint_GLenum_GLint_ptr
                                                                 *)0x0) {
                                                              pcVar20 = "glGetShaderInfoLog";
                                                              uStack_70 = 0x10543e;
                                                              ctx.glGetShaderInfoLog =
                                                                   (
                                                  _func_void_GLuint_GLsizei_GLsizei_ptr_char_ptr *)
                                                  SDL_GL_GetProcAddress("glGetShaderInfoLog");
                                                  if (ctx.glGetShaderInfoLog !=
                                                      (
                                                  _func_void_GLuint_GLsizei_GLsizei_ptr_char_ptr *)
                                                  0x0) {
                                                    pcVar20 = "glGetShaderiv";
                                                    uStack_70 = 0x10545d;
                                                    ctx.glGetShaderiv =
                                                         (_func_void_GLuint_GLenum_GLint_ptr *)
                                                         SDL_GL_GetProcAddress("glGetShaderiv");
                                                    if (ctx.glGetShaderiv !=
                                                        (_func_void_GLuint_GLenum_GLint_ptr *)0x0) {
                                                      pcVar20 = "glGetUniformLocation";
                                                      uStack_70 = 0x10547c;
                                                      ctx.glGetUniformLocation =
                                                           (_func_GLint_GLuint_char_ptr *)
                                                           SDL_GL_GetProcAddress
                                                                     ("glGetUniformLocation");
                                                      if (ctx.glGetUniformLocation !=
                                                          (_func_GLint_GLuint_char_ptr *)0x0) {
                                                        pcVar20 = "glLinkProgram";
                                                        uStack_70 = 0x10549b;
                                                        ctx.glLinkProgram =
                                                             (_func_void_GLuint *)
                                                             SDL_GL_GetProcAddress("glLinkProgram");
                                                        if (ctx.glLinkProgram !=
                                                            (_func_void_GLuint *)0x0) {
                                                          pcVar20 = "glPixelStorei";
                                                          uStack_70 = 0x1054ba;
                                                          ctx.glPixelStorei =
                                                               (_func_void_GLenum_GLint *)
                                                               SDL_GL_GetProcAddress
                                                                         ("glPixelStorei");
                                                          if (ctx.glPixelStorei !=
                                                              (_func_void_GLenum_GLint *)0x0) {
                                                            pcVar20 = "glReadPixels";
                                                            uStack_70 = 0x1054d9;
                                                            ctx.glReadPixels =
                                                                 (
                                                  _func_void_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr
                                                  *)SDL_GL_GetProcAddress("glReadPixels");
                                                  if (ctx.glReadPixels !=
                                                      (
                                                  _func_void_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr
                                                  *)0x0) {
                                                    pcVar20 = "glScissor";
                                                    uStack_70 = 0x1054f8;
                                                    ctx.glScissor =
                                                         (_func_void_GLint_GLint_GLsizei_GLsizei *)
                                                         SDL_GL_GetProcAddress("glScissor");
                                                    if (ctx.glScissor !=
                                                        (_func_void_GLint_GLint_GLsizei_GLsizei *)
                                                        0x0) {
                                                      pcVar20 = "glShaderBinary";
                                                      uStack_70 = 0x105517;
                                                      ctx.glShaderBinary =
                                                           (
                                                  _func_void_GLsizei_GLuint_ptr_GLenum_void_ptr_GLsizei
                                                  *)SDL_GL_GetProcAddress("glShaderBinary");
                                                  if (ctx.glShaderBinary !=
                                                      (
                                                  _func_void_GLsizei_GLuint_ptr_GLenum_void_ptr_GLsizei
                                                  *)0x0) {
                                                    pcVar20 = "glShaderSource";
                                                    uStack_70 = 0x105536;
                                                    ctx.glShaderSource =
                                                         (
                                                  _func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr
                                                  *)SDL_GL_GetProcAddress("glShaderSource");
                                                  if (ctx.glShaderSource !=
                                                      (
                                                  _func_void_GLuint_GLsizei_GLchar_ptr_ptr_GLint_ptr
                                                  *)0x0) {
                                                    pcVar20 = "glTexImage2D";
                                                    uStack_70 = 0x105555;
                                                    ctx.glTexImage2D =
                                                         (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_void_ptr
                                                  *)SDL_GL_GetProcAddress("glTexImage2D");
                                                  if (ctx.glTexImage2D !=
                                                      (
                                                  _func_void_GLenum_GLint_GLint_GLsizei_GLsizei_GLint_GLenum_GLenum_void_ptr
                                                  *)0x0) {
                                                    pcVar20 = "glTexParameteri";
                                                    uStack_70 = 0x105574;
                                                    ctx.glTexParameteri =
                                                         (_func_void_GLenum_GLenum_GLint *)
                                                         SDL_GL_GetProcAddress("glTexParameteri");
                                                    if (ctx.glTexParameteri !=
                                                        (_func_void_GLenum_GLenum_GLint *)0x0) {
                                                      pcVar20 = "glTexSubImage2D";
                                                      uStack_70 = 0x105593;
                                                      ctx.glTexSubImage2D =
                                                           (
                                                  _func_void_GLenum_GLint_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr
                                                  *)SDL_GL_GetProcAddress("glTexSubImage2D");
                                                  if (ctx.glTexSubImage2D !=
                                                      (
                                                  _func_void_GLenum_GLint_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_GLvoid_ptr
                                                  *)0x0) {
                                                    pcVar20 = "glUniform1i";
                                                    uStack_70 = 0x1055b2;
                                                    ctx.glUniform1i =
                                                         (_func_void_GLint_GLint *)
                                                         SDL_GL_GetProcAddress("glUniform1i");
                                                    if (ctx.glUniform1i !=
                                                        (_func_void_GLint_GLint *)0x0) {
                                                      pcVar20 = "glUniform4f";
                                                      uStack_70 = 0x1055d1;
                                                      ctx.glUniform4f =
                                                           (
                                                  _func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *
                                                  )SDL_GL_GetProcAddress("glUniform4f");
                                                  if (ctx.glUniform4f !=
                                                      (
                                                  _func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *
                                                  )0x0) {
                                                    pcVar20 = "glUniformMatrix4fv";
                                                    uStack_70 = 0x1055f0;
                                                    ctx.glUniformMatrix4fv =
                                                         (
                                                  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
                                                  SDL_GL_GetProcAddress("glUniformMatrix4fv");
                                                  if (ctx.glUniformMatrix4fv !=
                                                      (
                                                  _func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
                                                  0x0) {
                                                    pcVar20 = "glUseProgram";
                                                    uStack_70 = 0x10560f;
                                                    ctx.glUseProgram =
                                                         (_func_void_GLuint *)
                                                         SDL_GL_GetProcAddress("glUseProgram");
                                                    if (ctx.glUseProgram != (_func_void_GLuint *)0x0
                                                       ) {
                                                      pcVar20 = "glVertexAttribPointer";
                                                      uStack_70 = 0x10562e;
                                                      ctx.glVertexAttribPointer =
                                                           (
                                                  _func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_void_ptr
                                                  *)SDL_GL_GetProcAddress("glVertexAttribPointer");
                                                  if (ctx.glVertexAttribPointer !=
                                                      (
                                                  _func_void_GLuint_GLint_GLenum_GLboolean_GLsizei_void_ptr
                                                  *)0x0) {
                                                    pcVar20 = "glViewport";
                                                    uStack_70 = 0x10564d;
                                                    ctx.glViewport =
                                                         (_func_void_GLint_GLint_GLsizei_GLsizei *)
                                                         SDL_GL_GetProcAddress("glViewport");
                                                    if (ctx.glViewport !=
                                                        (_func_void_GLint_GLint_GLsizei_GLsizei *)
                                                        0x0) {
                                                      pcVar20 = "glBindFramebuffer";
                                                      uStack_70 = 0x10566c;
                                                      ctx.glBindFramebuffer =
                                                           (_func_void_GLenum_GLuint *)
                                                           SDL_GL_GetProcAddress
                                                                     ("glBindFramebuffer");
                                                      if (ctx.glBindFramebuffer !=
                                                          (_func_void_GLenum_GLuint *)0x0) {
                                                        pcVar20 = "glFramebufferTexture2D";
                                                        uStack_70 = 0x10568b;
                                                        ctx.glFramebufferTexture2D =
                                                             (
                                                  _func_void_GLenum_GLenum_GLenum_GLuint_GLint *)
                                                  SDL_GL_GetProcAddress("glFramebufferTexture2D");
                                                  if (ctx.glFramebufferTexture2D !=
                                                      (_func_void_GLenum_GLenum_GLenum_GLuint_GLint
                                                       *)0x0) {
                                                    pcVar20 = "glCheckFramebufferStatus";
                                                    uStack_70 = 0x1056aa;
                                                    ctx.glCheckFramebufferStatus =
                                                         (_func_GLenum_GLenum *)
                                                         SDL_GL_GetProcAddress
                                                                   ("glCheckFramebufferStatus");
                                                    if (ctx.glCheckFramebufferStatus !=
                                                        (_func_GLenum_GLenum *)0x0) {
                                                      pcVar20 = "glDeleteFramebuffers";
                                                      uStack_70 = 0x1056c9;
                                                      ctx.glDeleteFramebuffers =
                                                           (_func_void_GLsizei_GLuint_ptr *)
                                                           SDL_GL_GetProcAddress
                                                                     ("glDeleteFramebuffers");
                                                      if (ctx.glDeleteFramebuffers !=
                                                          (_func_void_GLsizei_GLuint_ptr *)0x0) {
                                                        pcVar20 = "glGetAttribLocation";
                                                        uStack_70 = 0x1056e8;
                                                        ctx.glGetAttribLocation =
                                                             (_func_GLint_GLuint_GLchar_ptr *)
                                                             SDL_GL_GetProcAddress
                                                                       ("glGetAttribLocation");
                                                        if (ctx.glGetAttribLocation !=
                                                            (_func_GLint_GLuint_GLchar_ptr *)0x0) {
                                                          pcVar20 = "glGetProgramInfoLog";
                                                          uStack_70 = 0x105707;
                                                          ctx.glGetProgramInfoLog =
                                                               (
                                                  _func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *
                                                  )SDL_GL_GetProcAddress("glGetProgramInfoLog");
                                                  if (ctx.glGetProgramInfoLog !=
                                                      (
                                                  _func_void_GLuint_GLsizei_GLsizei_ptr_GLchar_ptr *
                                                  )0x0) {
                                                    pcVar20 = "glGenBuffers";
                                                    uStack_70 = 0x105722;
                                                    ctx.glGenBuffers =
                                                         (_func_void_GLsizei_GLuint_ptr *)
                                                         SDL_GL_GetProcAddress("glGenBuffers");
                                                    if (ctx.glGenBuffers !=
                                                        (_func_void_GLsizei_GLuint_ptr *)0x0) {
                                                      pcVar20 = "glBindBuffer";
                                                      uStack_70 = 0x10573d;
                                                      ctx.glBindBuffer =
                                                           (_func_void_GLenum_GLuint *)
                                                           SDL_GL_GetProcAddress("glBindBuffer");
                                                      if (ctx.glBindBuffer !=
                                                          (_func_void_GLenum_GLuint *)0x0) {
                                                        pcVar20 = "glBufferData";
                                                        uStack_70 = 0x105758;
                                                        ctx.glBufferData =
                                                             (
                                                  _func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)
                                                  SDL_GL_GetProcAddress("glBufferData");
                                                  if (ctx.glBufferData !=
                                                      (
                                                  _func_void_GLenum_GLsizeiptr_GLvoid_ptr_GLenum *)
                                                  0x0) {
                                                    pcVar20 = "glBufferSubData";
                                                    uStack_70 = 0x105773;
                                                    ctx.glBufferSubData =
                                                         (
                                                  _func_void_GLenum_GLintptr_GLsizeiptr_GLvoid_ptr *
                                                  )SDL_GL_GetProcAddress("glBufferSubData");
                                                  puVar18 = (undefined8 *)auStack_68;
                                                  if (ctx.glBufferSubData !=
                                                      (
                                                  _func_void_GLenum_GLintptr_GLsizeiptr_GLvoid_ptr *
                                                  )0x0) goto LAB_001057b2;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          uStack_70 = 0x105784;
          uVar13 = SDL_GetError();
          uStack_70 = 0x105798;
          iVar7 = SDL_SetError("Couldn\'t load GLES2 function %s: %s\n",pcVar20,uVar13);
          puVar18 = (undefined8 *)auStack_68;
          if (-1 < iVar7) goto LAB_001057b2;
          pcVar20 = "Could not load GLES2 functions\n";
          goto LAB_001057a3;
        }
        uStack_70 = 0x1050db;
        pvVar14 = (SDL_GLContext)SDL_GL_CreateContext(state->windows[lVar19]);
        context[lVar19] = pvVar14;
        lVar19 = lVar19 + 1;
      } while (pvVar14 != (SDL_GLContext)0x0);
      uStack_70 = 0x1050f3;
      uVar13 = SDL_GetError();
      uStack_70 = 0x105104;
      SDL_Log("SDL_GL_CreateContext(): %s\n",uVar13);
    }
  }
  puVar17 = &uStack_70;
  uStack_70 = 2;
  goto LAB_001057ac;
}

Assistant:

int
main(int argc, char *argv[])
{
    int fsaa, accel;
    int value;
    int i;
    SDL_DisplayMode mode;
    Uint32 then, now;
    int status;
    shader_data *data;

    /* Initialize parameters */
    fsaa = 0;
    accel = 0;

    /* Initialize test framework */
    state = SDLTest_CommonCreateState(argv, SDL_INIT_VIDEO);
    if (!state) {
        return 1;
    }
    for (i = 1; i < argc;) {
        int consumed;

        consumed = SDLTest_CommonArg(state, i);
        if (consumed == 0) {
            if (SDL_strcasecmp(argv[i], "--fsaa") == 0) {
                ++fsaa;
                consumed = 1;
            } else if (SDL_strcasecmp(argv[i], "--accel") == 0) {
                ++accel;
                consumed = 1;
            } else if (SDL_strcasecmp(argv[i], "--zdepth") == 0) {
                i++;
                if (!argv[i]) {
                    consumed = -1;
                } else {
                    depth = SDL_atoi(argv[i]);
                    consumed = 1;
                }
            } else {
                consumed = -1;
            }
        }
        if (consumed < 0) {
            SDL_Log ("Usage: %s %s [--fsaa] [--accel] [--zdepth %%d]\n", argv[0],
                    SDLTest_CommonUsage(state));
            quit(1);
        }
        i += consumed;
    }

    /* Set OpenGL parameters */
    state->window_flags |= SDL_WINDOW_OPENGL | SDL_WINDOW_RESIZABLE | SDL_WINDOW_BORDERLESS | SDL_WINDOW_FULLSCREEN;
    state->gl_red_size = 5;
    state->gl_green_size = 5;
    state->gl_blue_size = 5;
    state->gl_depth_size = depth;
    state->gl_major_version = 2;
    state->gl_minor_version = 0;
    state->gl_profile_mask = SDL_GL_CONTEXT_PROFILE_ES;

    if (fsaa) {
        state->gl_multisamplebuffers=1;
        state->gl_multisamplesamples=fsaa;
    }
    if (accel) {
        state->gl_accelerated=1;
    }
    if (!SDLTest_CommonInit(state)) {
        quit(2);
        return 0;
    }

    context = SDL_calloc(state->num_windows, sizeof(context));
    if (context == NULL) {
        SDL_Log("Out of memory!\n");
        quit(2);
    }
    
    /* Create OpenGL ES contexts */
    for (i = 0; i < state->num_windows; i++) {
        context[i] = SDL_GL_CreateContext(state->windows[i]);
        if (!context[i]) {
            SDL_Log("SDL_GL_CreateContext(): %s\n", SDL_GetError());
            quit(2);
        }
    }

    /* Important: call this *after* creating the context */
    if (LoadContext(&ctx) < 0) {
        SDL_Log("Could not load GLES2 functions\n");
        quit(2);
        return 0;
    }


    if (state->render_flags & SDL_RENDERER_PRESENTVSYNC) {
        SDL_GL_SetSwapInterval(1);
    } else {
        SDL_GL_SetSwapInterval(0);
    }

    SDL_GetCurrentDisplayMode(0, &mode);
    SDL_Log("Screen bpp: %d\n", SDL_BITSPERPIXEL(mode.format));
    SDL_Log("\n");
    SDL_Log("Vendor     : %s\n", ctx.glGetString(GL_VENDOR));
    SDL_Log("Renderer   : %s\n", ctx.glGetString(GL_RENDERER));
    SDL_Log("Version    : %s\n", ctx.glGetString(GL_VERSION));
    SDL_Log("Extensions : %s\n", ctx.glGetString(GL_EXTENSIONS));
    SDL_Log("\n");

    status = SDL_GL_GetAttribute(SDL_GL_RED_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_RED_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_RED_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_GREEN_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_GREEN_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_GREEN_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_BLUE_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_BLUE_SIZE: requested %d, got %d\n", 5, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_BLUE_SIZE: %s\n",
                SDL_GetError());
    }
    status = SDL_GL_GetAttribute(SDL_GL_DEPTH_SIZE, &value);
    if (!status) {
        SDL_Log("SDL_GL_DEPTH_SIZE: requested %d, got %d\n", depth, value);
    } else {
        SDL_Log( "Failed to get SDL_GL_DEPTH_SIZE: %s\n",
                SDL_GetError());
    }
    if (fsaa) {
        status = SDL_GL_GetAttribute(SDL_GL_MULTISAMPLEBUFFERS, &value);
        if (!status) {
            SDL_Log("SDL_GL_MULTISAMPLEBUFFERS: requested 1, got %d\n", value);
        } else {
            SDL_Log( "Failed to get SDL_GL_MULTISAMPLEBUFFERS: %s\n",
                    SDL_GetError());
        }
        status = SDL_GL_GetAttribute(SDL_GL_MULTISAMPLESAMPLES, &value);
        if (!status) {
            SDL_Log("SDL_GL_MULTISAMPLESAMPLES: requested %d, got %d\n", fsaa,
                   value);
        } else {
            SDL_Log( "Failed to get SDL_GL_MULTISAMPLESAMPLES: %s\n",
                    SDL_GetError());
        }
    }
    if (accel) {
        status = SDL_GL_GetAttribute(SDL_GL_ACCELERATED_VISUAL, &value);
        if (!status) {
            SDL_Log("SDL_GL_ACCELERATED_VISUAL: requested 1, got %d\n", value);
        } else {
            SDL_Log( "Failed to get SDL_GL_ACCELERATED_VISUAL: %s\n",
                    SDL_GetError());
        }
    }

    datas = SDL_calloc(state->num_windows, sizeof(shader_data));

    /* Set rendering settings for each context */
    for (i = 0; i < state->num_windows; ++i) {

        int w, h;
        status = SDL_GL_MakeCurrent(state->windows[i], context[i]);
        if (status) {
            SDL_Log("SDL_GL_MakeCurrent(): %s\n", SDL_GetError());

            /* Continue for next window */
            continue;
        }
        SDL_GL_GetDrawableSize(state->windows[i], &w, &h);
        ctx.glViewport(0, 0, w, h);

        data = &datas[i];
        data->angle_x = 0; data->angle_y = 0; data->angle_z = 0;

        /* Shader Initialization */
        process_shader(&data->shader_vert, _shader_vert_src, GL_VERTEX_SHADER);
        process_shader(&data->shader_frag, _shader_frag_src, GL_FRAGMENT_SHADER);

        /* Create shader_program (ready to attach shaders) */
        data->shader_program = GL_CHECK(ctx.glCreateProgram());

        /* Attach shaders and link shader_program */
        GL_CHECK(ctx.glAttachShader(data->shader_program, data->shader_vert));
        GL_CHECK(ctx.glAttachShader(data->shader_program, data->shader_frag));
        GL_CHECK(ctx.glLinkProgram(data->shader_program));

        /* Get attribute locations of non-fixed attributes like color and texture coordinates. */
        data->attr_position = GL_CHECK(ctx.glGetAttribLocation(data->shader_program, "av4position"));
        data->attr_color = GL_CHECK(ctx.glGetAttribLocation(data->shader_program, "av3color"));

        /* Get uniform locations */
        data->attr_mvp = GL_CHECK(ctx.glGetUniformLocation(data->shader_program, "mvp"));

        GL_CHECK(ctx.glUseProgram(data->shader_program));

        /* Enable attributes for position, color and texture coordinates etc. */
        GL_CHECK(ctx.glEnableVertexAttribArray(data->attr_position));
        GL_CHECK(ctx.glEnableVertexAttribArray(data->attr_color));

        /* Populate attributes for position, color and texture coordinates etc. */
        GL_CHECK(ctx.glVertexAttribPointer(data->attr_position, 3, GL_FLOAT, GL_FALSE, 0, _vertices));
        GL_CHECK(ctx.glVertexAttribPointer(data->attr_color, 3, GL_FLOAT, GL_FALSE, 0, _colors));

        GL_CHECK(ctx.glEnable(GL_CULL_FACE));
        GL_CHECK(ctx.glEnable(GL_DEPTH_TEST));
    }

    /* Main render loop */
    frames = 0;
    then = SDL_GetTicks();
    done = 0;

    while (!done) {
        loop();
    }

    /* Print out some timing information */
    now = SDL_GetTicks();

    if (now > then) {
        SDL_Log("%2.2f frames per second\n",
               ((double) frames * 1000) / (now - then));
    }

    quit(0);
    return 0;
}